

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_inline_table_like<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  size_t *psVar1;
  byte bVar2;
  element_type *peVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  location checkpoint;
  sequence local_188;
  sequence local_168;
  location local_148;
  region local_100;
  region local_98;
  
  psVar1 = &loc->location_;
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar6 = loc->location_;
  lVar5 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar5;
  if (uVar6 + 1 < uVar4) {
    if (*(char *)(lVar5 + uVar6) == '\n') {
      loc->line_number_ = loc->line_number_ + 1;
      sVar7 = 1;
    }
    else {
      sVar7 = loc->column_number_ + 1;
    }
    loc->column_number_ = sVar7;
    uVar6 = uVar6 + 1;
  }
  else if (uVar4 != uVar6) {
    sVar7 = loc->line_number_;
    sVar8 = loc->column_number_;
    do {
      if (*(char *)(lVar5 + uVar6) == '\n') {
        sVar7 = sVar7 + 1;
        loc->line_number_ = sVar7;
        sVar8 = 1;
      }
      else {
        sVar8 = sVar8 + 1;
      }
      loc->column_number_ = sVar8;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
    *psVar1 = uVar4;
    return;
  }
  *psVar1 = uVar6;
  if (uVar6 < uVar4) {
    do {
      bVar2 = *(byte *)(lVar5 + uVar6);
      if (bVar2 < 0x27) {
        if (bVar2 == 10) {
          if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == false) {
            return;
          }
          if (uVar6 + 1 < uVar4) {
            loc->line_number_ = loc->line_number_ + 1;
            sVar7 = 1;
            goto LAB_003e7113;
          }
LAB_003e711c:
          sVar7 = loc->line_number_;
          sVar8 = loc->column_number_;
          do {
            if (*(char *)(lVar5 + uVar6) == '\n') {
              sVar7 = sVar7 + 1;
              loc->line_number_ = sVar7;
              sVar8 = 1;
            }
            else {
              sVar8 = sVar8 + 1;
            }
            loc->column_number_ = sVar8;
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
LAB_003e7147:
          *psVar1 = uVar4;
        }
        else {
          if (bVar2 == 0x22) goto LAB_003e70b9;
          if (bVar2 != 0x23) goto LAB_003e7103;
          skip_comment_block<toml::type_config>(loc,ctx);
          if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == false) {
            return;
          }
        }
      }
      else if (bVar2 < 0x7b) {
        if (bVar2 == 0x27) {
LAB_003e70b9:
          skip_string_like<toml::type_config>(loc,ctx);
        }
        else {
          if (bVar2 != 0x5b) goto LAB_003e7103;
          location::location(&local_148,loc);
          syntax::std_table(&local_188,&ctx->toml_spec_);
          sequence::scan(&local_100,&local_188,loc);
          if (local_100.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) {
            region::~region(&local_100);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector(&local_188.others_);
LAB_003e71c7:
            (loc->source_).
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_148.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(loc->source_).
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       &local_148.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&loc->source_name_,&local_148.source_name_);
            loc->column_number_ = local_148.column_number_;
            *psVar1 = local_148.location_;
            loc->line_number_ = local_148.line_number_;
            location::~location(&local_148);
            return;
          }
          syntax::array_table(&local_168,&ctx->toml_spec_);
          sequence::scan(&local_98,&local_168,loc);
          peVar3 = local_98.source_.
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          region::~region(&local_98);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_168.others_);
          region::~region(&local_100);
          std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
          ::~vector(&local_188.others_);
          if (peVar3 != (element_type *)0x0) goto LAB_003e71c7;
          skip_array_like<toml::type_config>(loc,ctx);
          location::~location(&local_148);
        }
      }
      else {
        if (bVar2 != 0x7b) {
          if (bVar2 == 0x7d) {
            return;
          }
LAB_003e7103:
          if (uVar4 <= uVar6 + 1) goto LAB_003e711c;
          sVar7 = loc->column_number_ + 1;
LAB_003e7113:
          uVar4 = uVar6 + 1;
          loc->column_number_ = sVar7;
          goto LAB_003e7147;
        }
        skip_inline_table_like<toml::type_config>(loc,ctx);
      }
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar6 = loc->location_;
      lVar5 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish - lVar5;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void skip_inline_table_like(location& loc, const context<TC>& ctx)
{
    assert(loc.current() == '{');
    loc.advance();

    const auto& spec = ctx.toml_spec();

    while( ! loc.eof())
    {
        if(loc.current() == '\n' && ! spec.v1_1_0_allow_newlines_in_inline_tables)
        {
            break; // missing closing `}`.
        }
        else if(loc.current() == '\"' || loc.current() == '\'')
        {
            skip_string_like(loc, ctx);
        }
        else if(loc.current() == '#')
        {
            skip_comment_block(loc, ctx);
            if( ! spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                // comment must end with newline.
                break; // missing closing `}`.
            }
        }
        else if(loc.current() == '[')
        {
            const auto checkpoint = loc;
            if(syntax::std_table(spec).scan(loc).is_ok() ||
               syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = checkpoint;
                break; // missing closing `}`.
            }
            // if it is not a table-definition, then it is an array.
            skip_array_like(loc, ctx);
        }
        else if(loc.current() == '{')
        {
            skip_inline_table_like(loc, ctx);
        }
        else if(loc.current() == '}')
        {
            // closing brace found. guessing the error is inside the table.
            break;
        }
        else
        {
            // skip otherwise.
            loc.advance();
        }
    }
    return ;
}